

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

optional<(anonymous_namespace)::VoicePos> *
anon_unknown.dwarf_41b5d::GetSampleOffset
          (BufferlistItem *BufferList,ALenum OffsetType,double Offset)

{
  memory_order mVar1;
  uint uVar2;
  ALuint AVar3;
  uint uVar4;
  ALbuffer *pAVar5;
  int in_EDX;
  __pointer_type in_RSI;
  optional<(anonymous_namespace)::VoicePos> *in_RDI;
  double in_XMM0_Qa;
  double dVar6;
  double dVar7;
  ALuint totalBufferLen;
  ALuint align_1;
  ALuint align;
  ALbuffer *origbuf;
  double dblfrac;
  double dbloff;
  ALuint frac;
  ALuint offset;
  BufferStorage *BufferFmt;
  optional<(anonymous_namespace)::VoicePos> *ret;
  VoicePos *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  memory_order in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  uint local_64;
  double local_48;
  undefined4 local_3c;
  uint local_38;
  BufferStorage *local_30;
  undefined1 local_21;
  double local_20;
  int local_14;
  __pointer_type local_10;
  
  local_21 = 0;
  local_20 = in_XMM0_Qa;
  local_14 = in_EDX;
  local_10 = in_RSI;
  al::optional<(anonymous_namespace)::VoicePos>::optional(in_RDI);
  local_30 = (BufferStorage *)0x0;
  while ((local_10 != (__pointer_type)0x0 &&
         (local_30 = local_10->mBuffer, local_30 == (BufferStorage *)0x0))) {
    local_10 = std::atomic<BufferlistItem_*>::load
                         ((atomic<BufferlistItem_*> *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          in_stack_ffffffffffffff44);
  }
  if (local_10 != (__pointer_type)0x0) {
    local_38 = 0;
    local_3c = 0;
    if (local_14 == 0x1024) {
      dVar6 = modf(local_20 * (double)local_30->mSampleRate,&local_48);
      uVar2 = std::numeric_limits<unsigned_int>::max();
      dVar7 = mind(local_48,(double)uVar2);
      local_38 = (uint)(long)dVar7;
      dVar6 = mind(dVar6 * 4096.0,4095.0);
      local_3c = (undefined4)(long)dVar6;
    }
    else if (local_14 == 0x1025) {
      dVar6 = modf(local_20,&local_48);
      uVar2 = std::numeric_limits<unsigned_int>::max();
      dVar7 = mind(local_48,(double)uVar2);
      local_38 = (uint)(long)dVar7;
      dVar6 = mind(dVar6 * 4096.0,4095.0);
      local_3c = (undefined4)(long)dVar6;
    }
    else if (local_14 == 0x1026) {
      pAVar5 = BufferFromStorage(local_30);
      local_38 = (uint)(long)local_20;
      if (pAVar5->OriginalType == UserFmtIMA4) {
        in_stack_ffffffffffffff4c = (pAVar5->OriginalAlign - 1 >> 1) + 4;
        AVar3 = ALbuffer::channelsFromFmt((ALbuffer *)0x16e0b8);
        local_38 = pAVar5->OriginalAlign * (local_38 / (in_stack_ffffffffffffff4c * AVar3));
      }
      else if (pAVar5->OriginalType == UserFmtMSADPCM) {
        in_stack_ffffffffffffff48 = (pAVar5->OriginalAlign - 2 >> 1) + 7;
        AVar3 = ALbuffer::channelsFromFmt((ALbuffer *)0x16e123);
        local_38 = pAVar5->OriginalAlign * (local_38 / (in_stack_ffffffffffffff48 * AVar3));
      }
      else {
        uVar4 = BufferStorage::frameSizeFromFmt
                          ((BufferStorage *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        local_38 = local_38 / uVar4;
      }
      local_3c = 0;
    }
    local_64 = 0;
    while( true ) {
      mVar1 = in_stack_ffffffffffffff44 & 0xffffff;
      if (local_10 != (__pointer_type)0x0) {
        mVar1 = CONCAT13(local_64 <= local_38,(int3)in_stack_ffffffffffffff44);
      }
      in_stack_ffffffffffffff44 = mVar1;
      if ((char)(in_stack_ffffffffffffff44 >> 0x18) == '\0') {
        return in_RDI;
      }
      if (local_38 - local_64 < local_10->mSampleLen) break;
      local_64 = local_10->mSampleLen + local_64;
      local_10 = std::atomic<BufferlistItem_*>::load
                           ((atomic<BufferlistItem_*> *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff44);
    }
    al::optional<(anonymous_namespace)::VoicePos>::
    operator=<(anonymous_namespace)::VoicePos,_true,_true>
              ((optional<(anonymous_namespace)::VoicePos> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
  }
  return in_RDI;
}

Assistant:

al::optional<VoicePos> GetSampleOffset(BufferlistItem *BufferList, ALenum OffsetType,
    double Offset)
{
    al::optional<VoicePos> ret;

    /* Find the first valid Buffer in the Queue */
    const BufferStorage *BufferFmt{nullptr};
    while(BufferList)
    {
        if((BufferFmt=BufferList->mBuffer) != nullptr) break;
        BufferList = BufferList->mNext.load(std::memory_order_relaxed);
    }
    if(!BufferList)
        return ret;

    /* Get sample frame offset */
    ALuint offset{0u}, frac{0u};
    double dbloff, dblfrac;
    switch(OffsetType)
    {
    case AL_SEC_OFFSET:
        dblfrac = std::modf(Offset*BufferFmt->mSampleRate, &dbloff);
        offset = static_cast<ALuint>(mind(dbloff, std::numeric_limits<ALuint>::max()));
        frac = static_cast<ALuint>(mind(dblfrac*MixerFracOne, MixerFracOne-1.0));
        break;

    case AL_SAMPLE_OFFSET:
        dblfrac = std::modf(Offset, &dbloff);
        offset = static_cast<ALuint>(mind(dbloff, std::numeric_limits<ALuint>::max()));
        frac = static_cast<ALuint>(mind(dblfrac*MixerFracOne, MixerFracOne-1.0));
        break;

    case AL_BYTE_OFFSET:
        /* Determine the ByteOffset (and ensure it is block aligned) */
        const ALbuffer *origbuf{BufferFromStorage(BufferFmt)};
        offset = static_cast<ALuint>(Offset);
        if(origbuf->OriginalType == UserFmtIMA4)
        {
            const ALuint align{(origbuf->OriginalAlign-1)/2 + 4};
            offset /= align * origbuf->channelsFromFmt();
            offset *= origbuf->OriginalAlign;
        }
        else if(origbuf->OriginalType == UserFmtMSADPCM)
        {
            const ALuint align{(origbuf->OriginalAlign-2)/2 + 7};
            offset /= align * origbuf->channelsFromFmt();
            offset *= origbuf->OriginalAlign;
        }
        else
            offset /= BufferFmt->frameSizeFromFmt();
        frac = 0;
        break;
    }

    /* Find the bufferlist item this offset belongs to. */
    ALuint totalBufferLen{0u};
    while(BufferList && totalBufferLen <= offset)
    {
        if(BufferList->mSampleLen > offset-totalBufferLen)
        {
            /* Offset is in this buffer */
            ret = {offset-totalBufferLen, frac, BufferList};
            return ret;
        }
        totalBufferLen += BufferList->mSampleLen;

        BufferList = BufferList->mNext.load(std::memory_order_relaxed);
    }

    /* Offset is out of range of the queue */
    return ret;
}